

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Packetizer.cpp
# Opt level: O2

void anon_unknown.dwarf_90a02::run(void)

{
  EVP_PKEY_CTX *pEVar1;
  size_t sVar2;
  RefCount *pRVar3;
  Box<(anonymous_namespace)::MyClass4> *this;
  Ptr<(anonymous_namespace)::IMyInterface> local_78;
  Ptr<(anonymous_namespace)::MyClass2> p;
  Ptr<(anonymous_namespace)::IMyInterface> p3;
  Ptr<(anonymous_namespace)::IMyInterface> p2;
  Ptr<(anonymous_namespace)::IMyInterface> local_38;
  
  run_Buf();
  pEVar1 = (EVP_PKEY_CTX *)axl::mem::allocate(0x18);
  *(undefined8 *)(pEVar1 + 8) = 0;
  *(undefined4 *)(pEVar1 + 0x10) = 0;
  *(undefined4 *)(pEVar1 + 0x14) = 1;
  *(undefined ***)pEVar1 = &PTR__MyClass2_0014a508;
  puts("MyClass2::MyClass2 ()");
  *(code **)(pEVar1 + 8) = axl::mem::deallocate;
  p.m_p = (MyClass2 *)0x0;
  p.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy(&p,pEVar1,pEVar1);
  pRVar3 = p.m_refCount;
  p2.m_refCount = (RefCount *)0x0;
  if (p.m_refCount != (RefCount *)0x0) {
    LOCK();
    (p.m_refCount)->m_weakRefCount = (p.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    p2.m_refCount = p.m_refCount;
  }
  p2.m_p = (IMyInterface *)p.m_p;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&p);
  p3.m_p = (IMyInterface *)0x0;
  p3.m_refCount = (RefCount *)0x0;
  if ((pRVar3 == (RefCount *)0x0) ||
     (sVar2 = axl::rc::RefCount::addRefByWeakPtr(pRVar3), sVar2 == 0)) {
    pRVar3 = (RefCount *)0x0;
    pEVar1 = (EVP_PKEY_CTX *)0x0;
  }
  else {
    p3.m_p = p2.m_p;
    p3.m_refCount = pRVar3;
    pEVar1 = (EVP_PKEY_CTX *)p2.m_p;
  }
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy(&p,pEVar1,(EVP_PKEY_CTX *)pRVar3);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::~Ptr((Ptr<(anonymous_namespace)::MyClass2> *)&p3);
  axl::rc::WeakPtr<(anonymous_namespace)::MyClass2>::~WeakPtr
            ((WeakPtr<(anonymous_namespace)::MyClass2> *)&p2);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::~Ptr(&p);
  p.m_p = (MyClass2 *)0x0;
  p.m_refCount = (RefCount *)0x0;
  p2.m_p = (IMyInterface *)0x0;
  p2.m_refCount = (RefCount *)0x0;
  p3.m_p = (IMyInterface *)0x0;
  p3.m_refCount = (RefCount *)0x0;
  pRVar3 = (RefCount *)axl::mem::allocate(0x188);
  pRVar3->m_freeFunc = (FreeFunc *)0x0;
  pRVar3->m_refCount = 0;
  pRVar3->m_weakRefCount = 1;
  pRVar3->_vptr_RefCount = (_func_int **)&PTR__MySuperContainer_0014a540;
  pRVar3[1]._vptr_RefCount = (_func_int **)&PTR_getChild_0014a578;
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)&pRVar3[1].m_freeFunc,pRVar3);
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)(pRVar3 + 8),pRVar3);
  axl::rc::Child<axl::rc::Box<(anonymous_namespace)::MyClass4>,_0UL>::Child
            ((Child<axl::rc::Box<(anonymous_namespace)::MyClass4>,_0UL> *)&pRVar3[0xe].m_refCount,
             pRVar3);
  puts("MySuperContainer::MySuperContainer ()");
  pRVar3->m_freeFunc = axl::mem::deallocate;
  local_78.m_p = (IMyInterface *)0x0;
  local_78.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            (&local_78,(EVP_PKEY_CTX *)(pRVar3 + 1),(EVP_PKEY_CTX *)pRVar3);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::operator=
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p,&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (*((p.m_p)->super_RefCount)._vptr_RefCount[1])();
  (*((p.m_p)->super_RefCount)._vptr_RefCount[2])();
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,1);
  (*(local_78.m_p)->_vptr_IMyInterface[1])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,1);
  (*(local_78.m_p)->_vptr_IMyInterface[2])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,2);
  (*(local_78.m_p)->_vptr_IMyInterface[1])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,2);
  (*(local_78.m_p)->_vptr_IMyInterface[2])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p);
  this = (Box<(anonymous_namespace)::MyClass4> *)axl::mem::allocate(0x20);
  axl::rc::Box<(anonymous_namespace)::MyClass4>::Box(this);
  (this->super_RefCount).m_freeFunc = axl::mem::deallocate;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::
  Ptr<axl::rc::Box<(anonymous_namespace)::MyClass4>>(&local_78,this);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::operator=(&p3,&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  pRVar3 = p3.m_refCount;
  local_78.m_refCount = (RefCount *)0x0;
  if (p3.m_refCount != (RefCount *)0x0) {
    LOCK();
    (p3.m_refCount)->m_weakRefCount = (p3.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    local_78.m_refCount = p3.m_refCount;
  }
  local_78.m_p = p3.m_p;
  (*(p3.m_p)->_vptr_IMyInterface[2])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&p3);
  local_38.m_p = (IMyInterface *)0x0;
  local_38.m_refCount = (RefCount *)0x0;
  if ((pRVar3 != (RefCount *)0x0) &&
     (sVar2 = axl::rc::RefCount::addRefByWeakPtr(pRVar3), sVar2 != 0)) {
    local_38.m_p = local_78.m_p;
    local_38.m_refCount = pRVar3;
  }
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::operator=
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p,&local_38);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_38);
  axl::rc::WeakPtr<(anonymous_namespace)::IMyInterface>::~WeakPtr
            ((WeakPtr<(anonymous_namespace)::IMyInterface> *)&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&p3);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&p2);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p);
  return;
}

Assistant:

void
run() {
	printf("test_Packetizer::Run ()\n");

	MyPacketizer packetizer;

	char data[] = "papapaapak:\xf\0\0\0pizda ivanovna";

	for (size_t i = 0; i < 64; i++) {
		char* p = data;
		size_t size = sizeof(data);

		size_t j = 0;
		for (; size; j++) {
			size_t chunkSize = rand() % (sizeof(data) + 1);
			if (chunkSize > size)
				chunkSize = size;

			packetizer.write(p, chunkSize);
			p += chunkSize;
			size -= chunkSize;
		}

		printf("complete (%d, %d chunks).\n", i, j);
	}

	sl::String s = "dsjsdljsdkl";
	s.clear();

	printf("done.\n");
}